

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O3

Elf_Xword __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::get_entries_num
          (dynamic_section_accessor_template<ELFIO::section> *this)

{
  _Head_base<0UL,_ELFIO::elf_header_*,_false> _Var1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar4;
  Elf_Xword index;
  ulong uVar5;
  Elf_Xword tag;
  Elf_Xword value;
  string str;
  Elf_Xword local_60 [2];
  string local_50;
  
  _Var1._M_head_impl =
       (this->elf_file->header)._M_t.
       super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
       super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
       super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (elf_header *)0x0) {
    uVar4 = 0x10;
  }
  else {
    iVar2 = (*(_Var1._M_head_impl)->_vptr_elf_header[4])();
    uVar4 = (ulong)((char)iVar2 != '\x01') * 8 + 8;
  }
  if (this->entries_num == 0) {
    iVar2 = (*this->dynamic_section->_vptr_section[0xf])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = (*this->dynamic_section->_vptr_section[0xf])();
      if (uVar4 <= CONCAT44(extraout_var_00,iVar2)) {
        iVar2 = (*this->dynamic_section->_vptr_section[0x13])();
        iVar3 = (*this->dynamic_section->_vptr_section[0xf])();
        this->entries_num = CONCAT44(extraout_var_01,iVar2) / CONCAT44(extraout_var_02,iVar3);
        local_60[0] = 0;
        local_60[1] = 0;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        if (CONCAT44(extraout_var_01,iVar2) < CONCAT44(extraout_var_02,iVar3)) {
          this->entries_num = 0;
        }
        else {
          index = 0;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          do {
            get_entry(this,index,local_60,local_60 + 1,&local_50);
            uVar4 = this->entries_num;
            if (local_60[0] == 0) break;
            index = index + 1;
          } while (index < uVar4);
          uVar5 = index + 1;
          if (uVar4 <= index + 1) {
            uVar5 = uVar4;
          }
          this->entries_num = uVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,
                            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                     local_50.field_2._M_local_buf[0]) + 1);
          }
        }
      }
    }
  }
  return this->entries_num;
}

Assistant:

Elf_Xword get_entries_num() const
    {
        size_t needed_entry_size = -1;
        if ( elf_file.get_class() == ELFCLASS32 ) {
            needed_entry_size = sizeof( Elf32_Dyn );
        }
        else {
            needed_entry_size = sizeof( Elf64_Dyn );
        }

        if ( ( 0 == entries_num ) &&
             ( 0 != dynamic_section->get_entry_size() &&
               dynamic_section->get_entry_size() >= needed_entry_size ) ) {
            entries_num =
                dynamic_section->get_size() / dynamic_section->get_entry_size();
            Elf_Xword   i;
            Elf_Xword   tag   = DT_NULL;
            Elf_Xword   value = 0;
            std::string str;
            for ( i = 0; i < entries_num; i++ ) {
                get_entry( i, tag, value, str );
                if ( tag == DT_NULL )
                    break;
            }
            entries_num = std::min<Elf_Xword>( entries_num, i + 1 );
        }

        return entries_num;
    }